

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_end(nk_context *ctx)

{
  nk_panel *layout;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cd,"void nk_end(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
        if ((ctx->current->layout->type == NK_PANEL_WINDOW) && ((ctx->current->flags & 0x1000) != 0)
           ) {
          ctx->current = (nk_window *)0x0;
        }
        else {
          nk_panel_end(ctx);
          nk_free_panel(ctx,ctx->current->layout);
          ctx->current = (nk_window *)0x0;
        }
      }
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cf,"void nk_end(struct nk_context *)");
  }
  __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x43ce,"void nk_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);

    layout = ctx->current->layout;
    if (!ctx || !ctx->current) return;
    if (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN)) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}